

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVT.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargeNVT::moveB(FluctuatingChargeNVT *this)

{
  reference pvVar1;
  SimInfo *in_RDI;
  RealType RVar2;
  double dVar3;
  RealType RVar4;
  double cvel_00;
  pair<double,_double> pVar5;
  int k;
  RealType cmass;
  RealType cvel;
  RealType cfrc;
  int index;
  RealType integralOfChidt;
  RealType prevChi;
  RealType oldChi;
  RealType chi;
  pair<double,_double> thermostat;
  RealType instTemp;
  Atom *atom;
  Molecule *mol;
  FluctuatingChargeIterator j;
  MoleculeIterator i;
  pair<double,_double> *in_stack_ffffffffffffff38;
  StuntDouble *in_stack_ffffffffffffff40;
  Snapshot *this_00;
  StuntDouble *in_stack_ffffffffffffff50;
  iterator *in_stack_ffffffffffffff58;
  int local_84;
  int local_64;
  double local_48;
  double local_40;
  Atom *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  if ((in_RDI->nAtoms_ & 1) != 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_18);
    pVar5 = Snapshot::getElectronicThermostat(*(Snapshot **)&in_RDI->nGlobalConstraints_);
    local_40 = pVar5.first;
    local_48 = local_40;
    local_64 = 0;
    local_20 = SimInfo::beginMolecule(in_RDI,(MoleculeIterator *)in_stack_ffffffffffffff58);
    while (local_20 != (Molecule *)0x0) {
      local_28 = Molecule::beginFluctuatingCharge((Molecule *)in_RDI,in_stack_ffffffffffffff58);
      while (local_28 != (Atom *)0x0) {
        in_stack_ffffffffffffff58 = (iterator *)StuntDouble::getFlucQVel(in_stack_ffffffffffffff40);
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&in_RDI->nBends_,
                            (long)local_64);
        *pvVar1 = (value_type)in_stack_ffffffffffffff58;
        local_64 = local_64 + 1;
        local_28 = Molecule::nextFluctuatingCharge((Molecule *)in_RDI,in_stack_ffffffffffffff58);
      }
      local_20 = SimInfo::nextMolecule(in_RDI,(MoleculeIterator *)in_stack_ffffffffffffff58);
    }
    for (local_84 = 0; local_84 < in_RDI->nConstraints_; local_84 = local_84 + 1) {
      local_64 = 0;
      RVar2 = Thermo::getElectronicTemperature((Thermo *)in_stack_ffffffffffffff50);
      dVar3 = local_40 +
              (*(double *)&in_RDI->nGlobalBonds_ * (RVar2 / *(double *)&in_RDI->nGlobalMols_ - 1.0))
              / (*(double *)&in_RDI->nGlobalCutoffGroups_ * *(double *)&in_RDI->nGlobalCutoffGroups_
                );
      local_20 = SimInfo::beginMolecule(in_RDI,(MoleculeIterator *)in_stack_ffffffffffffff58);
      while (local_20 != (Molecule *)0x0) {
        local_28 = Molecule::beginFluctuatingCharge((Molecule *)in_RDI,in_stack_ffffffffffffff58);
        while (local_28 != (Atom *)0x0) {
          RVar2 = StuntDouble::getFlucQFrc(in_stack_ffffffffffffff40);
          RVar4 = Atom::getChargeMass(local_28);
          pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&in_RDI->nBends_,
                              (long)local_64);
          in_stack_ffffffffffffff50 =
               (StuntDouble *)(*pvVar1 + (*(double *)&in_RDI->nGlobalBonds_ * RVar2) / RVar4);
          cvel_00 = *(double *)&in_RDI->nGlobalBonds_ * dVar3;
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)&in_RDI->nBends_,(long)local_64);
          StuntDouble::setFlucQVel(in_stack_ffffffffffffff50,cvel_00);
          local_64 = local_64 + 1;
          local_28 = Molecule::nextFluctuatingCharge((Molecule *)in_RDI,in_stack_ffffffffffffff58);
        }
        local_20 = SimInfo::nextMolecule(in_RDI,(MoleculeIterator *)in_stack_ffffffffffffff58);
      }
      if (ABS(local_48 - dVar3) <= *(double *)&in_RDI->nGlobalRigidBodies_) break;
      local_48 = dVar3;
    }
    this_00 = *(Snapshot **)&in_RDI->nGlobalConstraints_;
    std::make_pair<double&,double&>((double *)this_00,&in_stack_ffffffffffffff38->first);
    Snapshot::setElectronicThermostat(this_00,in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

void FluctuatingChargeNVT::moveB() {
    if (!hasFlucQ_) return;
    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType instTemp;
    pair<RealType, RealType> thermostat = snap->getElectronicThermostat();
    RealType chi                        = thermostat.first;
    RealType oldChi                     = chi;
    RealType prevChi;
    RealType integralOfChidt = thermostat.second;
    int index;
    RealType cfrc, cvel, cmass;

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        oldVel_[index] = atom->getFlucQVel();
        ++index;
      }
    }

    // do the iteration:

    for (int k = 0; k < maxIterNum_; k++) {
      index    = 0;
      instTemp = thermo.getElectronicTemperature();
      // evolve chi another half step using the temperature at t + dt/2
      prevChi = chi;
      chi     = oldChi + dt2_ * (instTemp / targetTemp_ - 1.0) /
                         (tauThermostat_ * tauThermostat_);

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          cfrc  = atom->getFlucQFrc();
          cmass = atom->getChargeMass();

          // velocity half step
          cvel = oldVel_[index] + dt2_ * cfrc / cmass -
                 dt2_ * chi * oldVel_[index];
          atom->setFlucQVel(cvel);
          ++index;
        }
      }
      if (fabs(prevChi - chi) <= chiTolerance_) break;
    }
    integralOfChidt += dt2_ * chi;
    snap->setElectronicThermostat(make_pair(chi, integralOfChidt));
  }